

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *this,
          initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> cont)

{
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  long lVar2;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_50;
  
  pMVar1 = cont._M_array;
  Stack(this,cont._M_len);
  for (lVar2 = cont._M_len * 0x30; lVar2 != 0; lVar2 = lVar2 + -0x30) {
    Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Monom(&local_50,pMVar1);
    push(this,&local_50);
    Kernel::RationalConstantType::~RationalConstantType(&local_50.numeral);
    pMVar1 = pMVar1 + 1;
  }
  return;
}

Assistant:

Stack(std::initializer_list<C> cont)
   : Stack(cont.size())
  {
    for (auto const& x : cont) {
      push(x);
    }
  }